

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_integer_sequence.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  bool local_31;
  
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 0> , integer_sequence<int> >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x1b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 1> , integer_sequence<int, 0> >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x1f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 2> , integer_sequence<int, 0, 1> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x23,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 3> , integer_sequence<int, 0, 1, 2> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x27,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 4> , integer_sequence<int, 0, 1, 2, 3> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x2b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 5> , integer_sequence<int, 0, 1, 2, 3, 4> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x2f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 6> , integer_sequence<int, 0, 1, 2, 3, 4, 5> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x33,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 7> , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x37,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 8> , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x3b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 9> , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7, 8> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x3f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 10> , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7, 8, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x43,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 0> , integer_sequence<int> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x49,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 1> , integer_sequence<int, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x4d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 2> , integer_sequence<int, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x51,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 3> , integer_sequence<int, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x55,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 4> , integer_sequence<int, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x59,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 5> , integer_sequence<int, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x5d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 6> , integer_sequence<int, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x61,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 7> , integer_sequence<int, 6, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x65,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 8> , integer_sequence<int, 7, 6, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x69,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 9> , integer_sequence<int, 8, 7, 6, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x6d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 10> , integer_sequence<int, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x71,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 0>
      , integer_sequence<int>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 1>
      , integer_sequence<int, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 2>
      , integer_sequence<int, 0, 1>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 3>
      , integer_sequence<int, 0, 1, 2>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 4>
      , integer_sequence<int, 0, 1, 2, 3>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 5>
      , integer_sequence<int, 0, 1, 2, 3, 4>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 6>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 7>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 8>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 9>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7, 8>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 10>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7, 8, 9>
    >::value), true);

    ///////////////////////////////////////////////////////////////////////////
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 0>
      , integer_sequence<int>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 1>
      , integer_sequence<int, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 2>
      , integer_sequence<int, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 3>
      , integer_sequence<int, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 4>
      , integer_sequence<int, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 5>
      , integer_sequence<int, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 6>
      , integer_sequence<int, 5, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 7>
      , integer_sequence<int, 6, 5, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 8>
      , integer_sequence<int, 7, 6, 5, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 9>
      , integer_sequence<int, 8, 7, 6, 5, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 10>
      , integer_sequence<int, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0>
    >::value), true);

    return boost::report_errors();
}